

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O3

int Psr_NtkCountObjects(Psr_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  iVar1 = (pNtk->vObjs).nSize;
  iVar6 = (pNtk->vInputs).nSize + (pNtk->vInouts).nSize + (pNtk->vOutputs).nSize + iVar1;
  if (0 < iVar1) {
    piVar4 = (pNtk->vObjs).pArray;
    lVar7 = 0;
    do {
      iVar1 = piVar4[lVar7];
      if (((long)iVar1 < 0) || (uVar2 = (pNtk->vBoxes).nSize, (int)uVar2 <= iVar1)) {
LAB_003b7a12:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar5 = (pNtk->vBoxes).pArray;
      Psr_BoxSignals_V._0_4_ = piVar5[iVar1] + -2;
      uVar3 = piVar4[lVar7];
      Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
      if (((long)(int)uVar3 < -3) || (uVar2 <= uVar3 + 3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      Psr_BoxSignals_V._8_8_ = piVar5 + (uVar3 + 3);
      lVar8 = (long)(pNtk->vObjs).nSize;
      if (((lVar8 <= lVar7) || ((int)uVar3 < 0)) || (uVar2 <= uVar3)) goto LAB_003b7a12;
      iVar6 = iVar6 + ((piVar5[(int)uVar3] - (piVar5[(int)uVar3] + -2 >> 0x1f)) + -2 >> 1);
      lVar7 = lVar7 + 1;
    } while (lVar7 < lVar8);
  }
  return iVar6;
}

Assistant:

int Psr_NtkCountObjects( Psr_Ntk_t * pNtk )
{
    Vec_Int_t * vFanins; 
    int i, Count = Psr_NtkObjNum(pNtk);
    Psr_NtkForEachBox( pNtk, vFanins, i )
        Count += Psr_BoxIONum(pNtk, i);
    return Count;
}